

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Functional::(anonymous_namespace)::ConstantShaderGenerator::next_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ShaderType shaderType)

{
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_75;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string outputName;
  string valueString;
  float value;
  ShaderType shaderType_local;
  ConstantShaderGenerator *this_local;
  string *source;
  
  valueString.field_2._12_4_ = shaderType;
  valueString.field_2._8_4_ = de::Random::getFloat((Random *)((long)this + 8),0.0,1.0);
  de::toString<float>((string *)((long)&outputName.field_2 + 8),
                      (float *)((long)&valueString.field_2 + 8));
  __s = "gl_FragColor";
  if (valueString.field_2._12_4_ == 0) {
    __s = "gl_Position";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,__s,&local_61);
  std::allocator<char>::~allocator(&local_61);
  local_75 = 0;
  std::operator+(&local_d8,"#version 100\nvoid main (void) { ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::operator+(&local_b8,&local_d8," = vec4(");
  std::operator+(&local_98,&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&outputName.field_2 + 8));
  std::operator+(__return_storage_ptr__,&local_98,"); }\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  local_75 = 1;
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(outputName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantShaderGenerator::next (const glu::ShaderType shaderType)
{
	DE_ASSERT(shaderType == glu::SHADERTYPE_VERTEX || shaderType == glu::SHADERTYPE_FRAGMENT);

	const float			value		= m_rnd.getFloat(0.0f, 1.0f);
	const std::string	valueString	= de::toString(value);
	const std::string	outputName	= (shaderType == glu::SHADERTYPE_VERTEX) ? "gl_Position" : "gl_FragColor";

	std::string source =
		"#version 100\n"
		"void main (void) { " + outputName + " = vec4(" + valueString + "); }\n";

	return source;
}